

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJacobiEigenSolver.cpp
# Opt level: O3

void testJacobiEigenSolver<Imath_3_2::Matrix33<double>>(Matrix33<double> *A)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  uint i;
  long lVar11;
  double *pdVar12;
  undefined1 *puVar13;
  uint i_1;
  double (*padVar14) [3];
  uint j;
  long lVar15;
  uint j_1;
  double dVar16;
  double threshold;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  Matrix33<double> MS;
  TV S;
  Matrix33<double> tmp;
  Matrix33<double> V;
  double local_1b0 [12];
  undefined8 uStack_150;
  double local_148;
  undefined8 uStack_140;
  double local_138;
  undefined8 uStack_130;
  double local_128;
  undefined8 uStack_120;
  Vec3 local_110 [24];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  double local_b8;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double local_60;
  double local_58;
  double dStack_50;
  double local_48;
  double local_40;
  double local_38;
  double dStack_30;
  double local_28;
  double local_20;
  
  dVar3 = 0.0;
  lVar11 = 0;
  padVar14 = (double (*) [3])A;
  do {
    lVar15 = 0;
    dVar16 = dVar3;
    do {
      dVar3 = ABS((*(double (*) [3])*padVar14)[lVar15]);
      if (dVar3 <= dVar16) {
        dVar3 = dVar16;
      }
      lVar15 = lVar15 + 1;
      dVar16 = dVar3;
    } while (lVar15 != 3);
    lVar11 = lVar11 + 1;
    padVar14 = padVar14 + 1;
  } while (lVar11 != 3);
  dVar16 = 2.220446049250313e-16;
  if (2.220446049250313e-16 <= dVar3) {
    dVar16 = dVar3;
  }
  threshold = dVar16 * 100.0 * 2.220446049250313e-16;
  local_a8 = A->x[0][0];
  dStack_a0 = A->x[0][1];
  local_98 = A->x[0][2];
  dStack_90 = A->x[1][0];
  local_88 = A->x[1][1];
  dStack_80 = A->x[1][2];
  local_78 = A->x[2][0];
  dStack_70 = A->x[2][1];
  local_68 = A->x[2][2];
  local_60 = 1.0;
  local_58 = 0.0;
  dStack_50 = 0.0;
  local_48 = 0.0;
  local_40 = 1.0;
  local_38 = 0.0;
  dStack_30 = 0.0;
  local_28 = 0.0;
  local_20 = 1.0;
  Imath_3_2::jacobiEigenSolver<double>
            ((Matrix33 *)&local_a8,local_110,(Matrix33 *)&local_60,2.220446049250313e-16);
  verifyOrthonormal<Imath_3_2::Matrix33<double>>((Matrix33<double> *)&local_60,threshold);
  dVar10 = local_20;
  dVar9 = local_28;
  dVar8 = dStack_30;
  dVar7 = local_38;
  dVar6 = local_40;
  dVar2 = local_48;
  dVar5 = dStack_50;
  dVar16 = local_58;
  dVar3 = local_60;
  if (threshold <=
      ABS((local_48 * local_28 - dStack_30 * local_40) * dStack_50 +
          (local_40 * local_20 - local_28 * local_38) * local_60 +
          (local_38 * dStack_30 - local_20 * local_48) * local_58) + -1.0) {
    __assert_fail("abs (V.determinant ()) - 1 < threshold",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                  ,0x67,"void testJacobiEigenSolver(const TM &) [TM = Imath_3_2::Matrix33<double>]")
    ;
  }
  pdVar12 = local_1b0;
  local_1b0[0] = 1.0;
  local_1b0[1] = 0.0;
  local_1b0[2] = 0.0;
  lVar11 = 0;
  local_1b0[3] = 0.0;
  local_1b0[4] = 1.0;
  local_1b0[5] = 0.0;
  local_1b0[6] = 0.0;
  local_1b0[7] = 0.0;
  local_1b0[8] = 1.0;
  do {
    lVar15 = 0;
    do {
      if (lVar11 == lVar15) {
        local_1b0[lVar11 * 4] = *(double *)(local_110 + lVar11 * 8);
      }
      else {
        pdVar12[lVar15] = 0.0;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    lVar11 = lVar11 + 1;
    pdVar12 = pdVar12 + 3;
  } while (lVar11 != 3);
  local_138 = dVar2;
  uStack_130 = 0;
  local_128 = dVar7;
  uStack_120 = 0;
  dVar4 = A->x[1][1];
  dVar17 = A->x[1][2];
  dVar18 = A->x[2][1];
  dVar19 = A->x[2][0];
  dVar20 = A->x[1][0];
  local_148 = local_1b0[5];
  uStack_140 = 0;
  dVar1 = A->x[2][2];
  if (ABS(A->x[0][2] * (dVar20 * dVar18 - dVar19 * dVar4) +
          A->x[0][0] * (dVar4 * dVar1 - dVar18 * dVar17) +
          A->x[0][1] * (dVar17 * dVar19 - dVar1 * dVar20)) -
      ABS(local_1b0[2] * (local_1b0[3] * local_1b0[7] - local_1b0[6] * local_1b0[4]) +
          local_1b0[0] * (local_1b0[4] * local_1b0[8] - local_1b0[7] * local_1b0[5]) +
          local_1b0[1] * (local_1b0[5] * local_1b0[6] - local_1b0[8] * local_1b0[3])) < threshold) {
    dVar23 = dVar10 * local_1b0[6] + dVar8 * local_1b0[0] + dVar9 * local_1b0[3];
    local_1b0[9] = dVar9;
    local_1b0[10] = 0.0;
    dVar1 = dVar10 * local_1b0[7] + dVar8 * local_1b0[1] + dVar9 * local_1b0[4];
    dVar24 = dVar10 * local_1b0[8] + dVar8 * local_1b0[2] + dVar9 * local_1b0[5];
    local_1b0[0xb] = dVar6;
    uStack_150 = 0;
    dVar21 = local_1b0[6] * dVar5 + local_1b0[0] * dVar3 + local_1b0[3] * dVar16;
    dVar22 = local_1b0[6] * dVar7 + local_1b0[0] * dVar2 + local_1b0[3] * dVar6;
    dVar19 = local_1b0[7] * dVar5 + local_1b0[1] * dVar3 + local_1b0[4] * dVar16;
    dVar20 = local_1b0[7] * dVar7 + local_1b0[1] * dVar2 + local_1b0[4] * dVar6;
    dVar17 = local_1b0[8] * dVar5 + local_1b0[2] * dVar3 + local_1b0[5] * dVar16;
    dVar18 = local_1b0[8] * dVar7 + local_1b0[2] * dVar2 + local_1b0[5] * dVar6;
    dVar4 = dVar17 * dVar7 + dVar21 * dVar2 + dVar19 * dVar6;
    puVar13 = local_f8;
    local_f8._8_4_ = SUB84(dVar4,0);
    local_f8._0_8_ = dVar17 * dVar5 + dVar21 * dVar3 + dVar19 * dVar16;
    local_f8._12_4_ = (int)((ulong)dVar4 >> 0x20);
    dVar4 = dVar5 * dVar18 + dVar3 * dVar22 + dVar16 * dVar20;
    local_e8._8_4_ = SUB84(dVar4,0);
    local_e8._0_8_ = dVar10 * dVar17 + dVar8 * dVar21 + dVar9 * dVar19;
    local_e8._12_4_ = (int)((ulong)dVar4 >> 0x20);
    dVar4 = dVar10 * dVar18 + dVar8 * dVar22 + dVar20 * dVar9;
    local_d8._8_4_ = SUB84(dVar4,0);
    local_d8._0_8_ = dVar7 * dVar18 + dVar2 * dVar22 + dVar20 * dVar6;
    local_d8._12_4_ = (int)((ulong)dVar4 >> 0x20);
    dVar2 = dVar24 * dVar7 + dVar23 * dVar2 + dVar1 * dVar6;
    local_c8._8_4_ = SUB84(dVar2,0);
    local_c8._0_8_ = dVar24 * dVar5 + dVar23 * dVar3 + dVar1 * dVar16;
    local_c8._12_4_ = (int)((ulong)dVar2 >> 0x20);
    local_b8 = dVar24 * dVar10 + dVar23 * dVar8 + dVar9 * dVar1;
    lVar11 = 0;
    do {
      lVar15 = 0;
      do {
        if (threshold <=
            ABS((*(double (*) [3])*(double (*) [3])A)[lVar15] - *(double *)(puVar13 + lVar15 * 8)))
        {
          __assert_fail("abs (A[i][j] - MA[i][j]) < threshold",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                        ,0x79,
                        "void testJacobiEigenSolver(const TM &) [TM = Imath_3_2::Matrix33<double>]")
          ;
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != 3);
      lVar11 = lVar11 + 1;
      A = (Matrix33<double> *)((long)A + 0x18);
      puVar13 = puVar13 + 0x18;
    } while (lVar11 != 3);
    return;
  }
  __assert_fail("abs (A.determinant ()) - abs (MS.determinant ()) < threshold",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                ,0x72,"void testJacobiEigenSolver(const TM &) [TM = Imath_3_2::Matrix33<double>]");
}

Assistant:

void
testJacobiEigenSolver (const TM& A)
{
    using std::abs;

    typedef typename TM::BaseType    T;
    typedef typename TM::BaseVecType TV;

    const T threshold = computeThreshold (A);

    TM AA (A);
    TV S;
    TM V;

    jacobiEigenSolver (AA, S, V);

    // Orthogonality of V
    verifyOrthonormal (V, threshold);

    // Determinant of V
    assert (abs (V.determinant ()) - 1 < threshold);

    // Determinant of A and S
    TM MS;
    for (unsigned int i = 0; i < TM::dimensions (); ++i)
        for (unsigned int j = 0; j < TM::dimensions (); ++j)
            if (i == j)
                MS[i][j] = S[i];
            else
                MS[i][j] = 0;

    assert (abs (A.determinant ()) - abs (MS.determinant ()) < threshold);

    // A = V * S * V^T
    TM MA = V * MS * V.transposed ();

    for (unsigned int i = 0; i < TM::dimensions (); ++i)
        for (unsigned int j = 0; j < TM::dimensions (); ++j)
            assert (abs (A[i][j] - MA[i][j]) < threshold);
}